

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

_Bool sum_binary(_Bool *a,_Bool *b,size_t length,_Bool *result)

{
  _Bool _Var1;
  _Bool _Var2;
  byte bVar3;
  byte bVar4;
  size_t n;
  
  bVar4 = 0;
  for (n = 0; length != n; n = n + 1) {
    _Var1 = b[n];
    _Var2 = a[n];
    result[n] = (_Bool)((bVar4 ^ _Var1 != _Var2) & 1);
    bVar3 = _Var1 != _Var2 & bVar4;
    bVar4 = 1;
    if (bVar3 == 0) {
      if (a[n] == true) {
        bVar4 = b[n];
      }
      else {
        bVar4 = 0;
      }
    }
  }
  return (_Bool)(bVar4 & 1);
}

Assistant:

bool sum_binary(const bool* a, const bool* b, const size_t length, bool* result) {
  bool carry = false;
  for (size_t n = 0; n < length; n++) {
    bool a_xor_b = (a[n] || b[n]) && !(a[n] && b[n]); // a ^ b
    result[n] = (a_xor_b || carry) && !(a_xor_b && carry); // (a ^ b) ^ carry
    carry = (a_xor_b && carry) || (a[n] && b[n]); // (a ^ b) ^ carry | a & b
  }
  return carry;
}